

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O0

int Abc_NtkDontCareCompute(Odc_Man_t *p,Abc_Obj_t *pNode,Vec_Ptr_t *vLeaves,uint *puTruth)

{
  int iVar1;
  uint uVar2;
  abctime aVar3;
  abctime aVar4;
  abctime aVar5;
  abctime clkTotal;
  abctime clk;
  int RetValue;
  int nMints;
  uint *puTruth_local;
  Vec_Ptr_t *vLeaves_local;
  Abc_Obj_t *pNode_local;
  Odc_Man_t *p_local;
  
  aVar3 = Abc_Clock();
  p->nWins = p->nWins + 1;
  iVar1 = Abc_ObjIsComplement(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcOdc.c"
                  ,0x411,
                  "int Abc_NtkDontCareCompute(Odc_Man_t *, Abc_Obj_t *, Vec_Ptr_t *, unsigned int *)"
                 );
  }
  iVar1 = Abc_ObjIsNode(pNode);
  if (iVar1 != 0) {
    iVar1 = Vec_PtrSize(vLeaves);
    if (iVar1 <= p->nVarsMax) {
      p->vLeaves = vLeaves;
      p->pNode = pNode;
      aVar4 = Abc_Clock();
      iVar1 = Abc_NtkDontCareWindow(p);
      aVar5 = Abc_Clock();
      p->timeWin = (aVar5 - aVar4) + p->timeWin;
      if (iVar1 == 0) {
        aVar4 = Abc_Clock();
        p->timeAbort = (aVar4 - aVar3) + p->timeAbort;
        Abc_InfoFill(puTruth,p->nWords);
        p->nWinsEmpty = p->nWinsEmpty + 1;
        p_local._4_4_ = 0;
      }
      else {
        if (p->fVeryVerbose != 0) {
          printf(" %5d : ",(ulong)(uint)pNode->Id);
          uVar2 = Vec_PtrSize(p->vLeaves);
          printf("Leaf = %2d ",(ulong)uVar2);
          uVar2 = Vec_PtrSize(p->vRoots);
          printf("Root = %2d ",(ulong)uVar2);
          uVar2 = Vec_PtrSize(p->vBranches);
          printf("Bran = %2d ",(ulong)uVar2);
          printf(" |  ");
        }
        aVar4 = Abc_Clock();
        Abc_NtkDontCareTransfer(p);
        aVar5 = Abc_Clock();
        p->timeMiter = (aVar5 - aVar4) + p->timeMiter;
        aVar4 = Abc_Clock();
        iVar1 = Abc_NtkDontCareSimulateBefore(p,puTruth);
        aVar5 = Abc_Clock();
        p->timeSim = (aVar5 - aVar4) + p->timeSim;
        if (p->fVeryVerbose != 0) {
          uVar2 = Odc_NodeNum(p);
          printf("AIG = %5d ",(ulong)uVar2);
          printf("%6.2f %%  ",((double)(p->nBits - iVar1) * 100.0) / (double)p->nBits);
        }
        if ((double)p->nPercCutoff * 1.0 <= ((double)(p->nBits - iVar1) * 100.0) / (double)p->nBits)
        {
          aVar4 = Abc_Clock();
          iVar1 = Abc_NtkDontCareQuantify(p);
          aVar5 = Abc_Clock();
          p->timeQuant = (aVar5 - aVar4) + p->timeQuant;
          if (iVar1 == 0) {
            aVar4 = Abc_Clock();
            p->timeAbort = (aVar4 - aVar3) + p->timeAbort;
            if (p->fVeryVerbose != 0) {
              printf("=== Overflow! ===\n");
            }
            Abc_InfoFill(puTruth,p->nWords);
            p->nQuantsOver = p->nQuantsOver + 1;
            p_local._4_4_ = 0;
          }
          else {
            aVar4 = Abc_Clock();
            Abc_NtkDontCareSimulateSetElem(p);
            p_local._4_4_ = Abc_NtkDontCareSimulate(p,puTruth);
            aVar5 = Abc_Clock();
            p->timeTruth = (aVar5 - aVar4) + p->timeTruth;
            if (p->fVeryVerbose != 0) {
              uVar2 = Odc_NodeNum(p);
              printf("AIG = %5d ",(ulong)uVar2);
              printf("%6.2f %%  ",((double)(p->nBits - p_local._4_4_) * 100.0) / (double)p->nBits);
              printf("\n");
            }
            aVar4 = Abc_Clock();
            p->timeTotal = (aVar4 - aVar3) + p->timeTotal;
            p->nWinsFinish = p->nWinsFinish + 1;
            p->nTotalDcs = (int)(((double)(p->nBits - p_local._4_4_) * 100.0) / (double)p->nBits) +
                           p->nTotalDcs;
          }
        }
        else {
          aVar4 = Abc_Clock();
          p->timeAbort = (aVar4 - aVar3) + p->timeAbort;
          if (p->fVeryVerbose != 0) {
            printf("Simulation cutoff.\n");
          }
          Abc_InfoFill(puTruth,p->nWords);
          p->nSimsEmpty = p->nSimsEmpty + 1;
          p_local._4_4_ = 0;
        }
      }
      return p_local._4_4_;
    }
    __assert_fail("Vec_PtrSize(vLeaves) <= p->nVarsMax",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcOdc.c"
                  ,0x413,
                  "int Abc_NtkDontCareCompute(Odc_Man_t *, Abc_Obj_t *, Vec_Ptr_t *, unsigned int *)"
                 );
  }
  __assert_fail("Abc_ObjIsNode(pNode)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcOdc.c"
                ,0x412,
                "int Abc_NtkDontCareCompute(Odc_Man_t *, Abc_Obj_t *, Vec_Ptr_t *, unsigned int *)")
  ;
}

Assistant:

int Abc_NtkDontCareCompute( Odc_Man_t * p, Abc_Obj_t * pNode, Vec_Ptr_t * vLeaves, unsigned * puTruth )
{
    int nMints, RetValue;
    abctime clk, clkTotal = Abc_Clock();

    p->nWins++;
    
    // set the parameters
    assert( !Abc_ObjIsComplement(pNode) );
    assert( Abc_ObjIsNode(pNode) );
    assert( Vec_PtrSize(vLeaves) <= p->nVarsMax );
    p->vLeaves = vLeaves;
    p->pNode = pNode;

    // compute the window
clk = Abc_Clock();
    RetValue = Abc_NtkDontCareWindow( p );
p->timeWin += Abc_Clock() - clk;
    if ( !RetValue )
    {
p->timeAbort += Abc_Clock() - clkTotal;
        Abc_InfoFill( puTruth, p->nWords );
        p->nWinsEmpty++;        
        return 0;
    }

    if ( p->fVeryVerbose )
    {
        printf( " %5d : ", pNode->Id );
        printf( "Leaf = %2d ", Vec_PtrSize(p->vLeaves) );
        printf( "Root = %2d ", Vec_PtrSize(p->vRoots) );
        printf( "Bran = %2d ", Vec_PtrSize(p->vBranches) );
        printf( " |  " );
    }

    // transfer the window into the AIG package
clk = Abc_Clock();
    Abc_NtkDontCareTransfer( p );
p->timeMiter += Abc_Clock() - clk;

    // simulate to estimate the amount of don't-cares
clk = Abc_Clock();
    nMints = Abc_NtkDontCareSimulateBefore( p, puTruth );
p->timeSim += Abc_Clock() - clk;
    if ( p->fVeryVerbose )
    {
        printf( "AIG = %5d ", Odc_NodeNum(p) );
        printf( "%6.2f %%  ", 100.0 * (p->nBits - nMints) / p->nBits );
    }

    // if there is less then the given percentage of don't-cares, skip
    if ( 100.0 * (p->nBits - nMints) / p->nBits < 1.0 * p->nPercCutoff )
    {
p->timeAbort += Abc_Clock() - clkTotal;
        if ( p->fVeryVerbose )
            printf( "Simulation cutoff.\n" );
        Abc_InfoFill( puTruth, p->nWords );
        p->nSimsEmpty++;
        return 0;
    }

    // quantify external variables
clk = Abc_Clock();
    RetValue = Abc_NtkDontCareQuantify( p );
p->timeQuant += Abc_Clock() - clk;
    if ( !RetValue )
    {
p->timeAbort += Abc_Clock() - clkTotal;
        if ( p->fVeryVerbose )
            printf( "=== Overflow! ===\n" );
        Abc_InfoFill( puTruth, p->nWords );
        p->nQuantsOver++;
        return 0;
    }

    // get the truth table
clk = Abc_Clock();
    Abc_NtkDontCareSimulateSetElem( p );
    nMints = Abc_NtkDontCareSimulate( p, puTruth );
p->timeTruth += Abc_Clock() - clk;
    if ( p->fVeryVerbose )
    {
        printf( "AIG = %5d ", Odc_NodeNum(p) );
        printf( "%6.2f %%  ", 100.0 * (p->nBits - nMints) / p->nBits );
        printf( "\n" );
    }
p->timeTotal += Abc_Clock() - clkTotal;
    p->nWinsFinish++;
    p->nTotalDcs += (int)(100.0 * (p->nBits - nMints) / p->nBits);
    return nMints;
}